

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_chunk.c
# Opt level: O0

void soa_chunk_init(soa_chunk_t *chunk,size_t blockSize,uchar numBlocks)

{
  uchar *puVar1;
  byte *local_28;
  uchar *p;
  uchar i;
  uchar numBlocks_local;
  size_t blockSize_local;
  soa_chunk_t *chunk_local;
  
  puVar1 = (uchar *)malloc(blockSize * numBlocks);
  chunk->blockData = puVar1;
  if (chunk->blockData != (uchar *)0x0) {
    chunk->firstBlock = '\0';
    chunk->freeBlocks = numBlocks;
    p._6_1_ = 0;
    local_28 = chunk->blockData;
    while (p._6_1_ < numBlocks) {
      p._6_1_ = p._6_1_ + 1;
      *local_28 = p._6_1_;
      local_28 = local_28 + blockSize;
    }
    if (local_28 != chunk->blockData + blockSize * numBlocks) {
      __assert_fail("p==chunk->blockData+(blockSize * numBlocks)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                    ,0x1e,"void soa_chunk_init(soa_chunk_t *, size_t, unsigned char)");
    }
  }
  return;
}

Assistant:

void soa_chunk_init( soa_chunk_t *chunk, size_t blockSize, unsigned char numBlocks )
{
  unsigned char i;
  unsigned char *p;
  chunk->blockData = (unsigned char*) malloc(blockSize * numBlocks);
  if(chunk->blockData == 0) return;
  chunk->firstBlock = 0;
  chunk->freeBlocks = numBlocks;
  for(i=0, p=chunk->blockData; i<numBlocks; p+=blockSize)
  {
    *p = ++i;
  }
  assert(p==chunk->blockData+(blockSize * numBlocks));
}